

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_bench.cc
# Opt level: O2

void do_bench(void)

{
  StatMatrix_t ppsVar1;
  fdb_status fVar2;
  StatAggregator *this;
  int iVar3;
  long *plVar4;
  ulong uVar5;
  UI *pUVar6;
  UI_STRING *pUVar7;
  long lVar8;
  UI_STRING *pUVar9;
  char *__format;
  fdb_kvs_handle **ppfVar10;
  fdb_kvs_handle **ptr_handle;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_file_handle *local_3a78 [16];
  char cmd [64];
  char dbname [64];
  char fname [64];
  fdb_config fconfig;
  fdb_kvs_handle *local_3838 [256];
  undefined8 local_3038 [256];
  fdb_kvs_handle *local_2838 [4];
  long local_2818 [1277];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  this = (StatAggregator *)operator_new(0x10);
  StatAggregator::StatAggregator(this,4,0x100);
  plVar4 = local_2818;
  for (lVar8 = 0; lVar8 != 0x3800; lVar8 = lVar8 + 0x38) {
    std::__cxx11::string::assign((char *)((long)&((*this->t_stats)->name)._M_dataplus._M_p + lVar8))
    ;
    std::__cxx11::string::assign((char *)((long)&(this->t_stats[1]->name)._M_dataplus._M_p + lVar8))
    ;
    std::__cxx11::string::assign((char *)((long)&(this->t_stats[2]->name)._M_dataplus._M_p + lVar8))
    ;
    std::__cxx11::string::assign((char *)((long)&(this->t_stats[3]->name)._M_dataplus._M_p + lVar8))
    ;
    ppsVar1 = this->t_stats;
    plVar4[-3] = (long)&((*ppsVar1)->name)._M_dataplus._M_p + lVar8;
    plVar4[-1] = (long)&(ppsVar1[1]->name)._M_dataplus._M_p + lVar8;
    plVar4[-2] = (long)&(ppsVar1[2]->name)._M_dataplus._M_p + lVar8;
    *plVar4 = (long)&(ppsVar1[3]->name)._M_dataplus._M_p + lVar8;
    plVar4 = plVar4 + 5;
  }
  builtin_strncpy(cmd + 0x10,"rlog.txt",9);
  builtin_strncpy(cmd,"rm bench* > erro",0x10);
  system(cmd);
  fconfig.compaction_mode = '\0';
  fconfig.auto_commit = false;
  fconfig.compactor_sleep_duration = 600;
  fconfig.prefetch_duration = 0;
  fconfig.num_compactor_threads = 1;
  fconfig.num_bgflusher_threads = 0;
  ppfVar10 = local_3838;
  uVar5 = 0;
  iVar3 = 0;
  while( true ) {
    if (uVar5 == 0x10) {
      lVar8 = 0;
      do {
        if (lVar8 == 0x10) {
          iVar3 = 0;
          while( true ) {
            pUVar7 = (UI_STRING *)local_3038;
            if (iVar3 == 5) {
              lVar8 = 0;
              do {
                if (lVar8 == 0x10) {
                  StatAggregator::aggregateAndPrintStats
                            (this,"ITERATOR_TEST_STATS",0x100,anon_var_dwarf_5e7);
                  StatAggregator::~StatAggregator(this);
                  operator_delete(this);
                  print_db_stats(local_3a78,0x10);
                  for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1) {
                    fdb_kvs_close(local_3838[lVar8]);
                    fdb_kvs_close((fdb_kvs_handle *)local_3038[lVar8]);
                  }
                  for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
                    fdb_close(local_3a78[lVar8]);
                  }
                  fdb_shutdown();
                  builtin_strncpy(cmd,"rm bench* > errorlog.txt",0x19);
                  system(cmd);
                  __format = "%s PASSED\n";
                  if (do_bench()::__test_pass != '\0') {
                    __format = "%s FAILED\n";
                  }
                  fprintf(_stderr,__format,"Benchmark done");
                  return;
                }
                fVar2 = fdb_compact(local_3a78[lVar8],(char *)0x0);
                lVar8 = lVar8 + 1;
              } while (fVar2 == FDB_RESULT_SUCCESS);
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                            ,0x16b,"void do_bench()");
            }
            pUVar9 = (UI_STRING *)0x0;
            writer((UI *)local_3838[0],(UI_STRING *)0x0);
            local_2838[0] = local_3838[0];
            reader((UI *)local_2838,pUVar9);
            pUVar9 = pUVar7;
            fVar2 = fdb_snapshot_open(local_3838[0],(fdb_kvs_handle **)pUVar7,0xffffffffffffffff);
            if (fVar2 != FDB_RESULT_SUCCESS) break;
            local_2838[0] = (fdb_kvs_handle *)local_3038[0];
            reader((UI *)local_2838,pUVar9);
            for (uVar5 = 0; uVar5 != 0x10; uVar5 = uVar5 + 1) {
              pUVar9 = (UI_STRING *)(uVar5 & 0xffffffff);
              writer((UI *)local_3838[uVar5],pUVar9);
            }
            for (uVar5 = 0; uVar5 != 0x10; uVar5 = uVar5 + 1) {
              pUVar9 = (UI_STRING *)(uVar5 & 0xffffffff);
              deletes(local_3838[uVar5],(int)uVar5);
            }
            pUVar6 = (UI *)local_2838;
            for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
              *(fdb_kvs_handle **)pUVar6 = local_3838[lVar8];
              reader(pUVar6,pUVar9);
              pUVar6 = pUVar6 + 0x28;
            }
            pUVar6 = (UI *)local_2838;
            for (lVar8 = 0; lVar8 != 0x80; lVar8 = lVar8 + 8) {
              pUVar9 = (UI_STRING *)((long)local_3038 + lVar8);
              fVar2 = fdb_snapshot_open(*(fdb_kvs_handle **)((long)local_3838 + lVar8),
                                        (fdb_kvs_handle **)pUVar9,0xffffffffffffffff);
              if (fVar2 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                        ,0x133);
                do_bench()::__test_pass = 1;
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                              ,0x133,"void do_bench()");
              }
              *(undefined8 *)pUVar6 = *(undefined8 *)((long)local_3038 + lVar8);
              reader(pUVar6,pUVar9);
              pUVar6 = pUVar6 + 0x28;
            }
            pUVar9 = (UI_STRING *)0x1;
            fVar2 = fdb_commit(local_3a78[0],'\x01');
            if (fVar2 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                            ,0x13a,"void do_bench()");
            }
            for (uVar5 = 0; uVar5 < 0x100; uVar5 = uVar5 + 0x10) {
              pUVar9 = (UI_STRING *)(uVar5 & 0xffffffff);
              writer((UI *)local_3838[uVar5],pUVar9);
            }
            for (uVar5 = 0; uVar5 < 0x100; uVar5 = uVar5 + 0x10) {
              pUVar9 = (UI_STRING *)(uVar5 & 0xffffffff);
              deletes(local_3838[uVar5],(int)uVar5);
            }
            pUVar6 = (UI *)local_2838;
            for (uVar5 = 0; uVar5 < 0x100; uVar5 = uVar5 + 0x10) {
              *(fdb_kvs_handle **)pUVar6 = local_3838[uVar5];
              reader(pUVar6,pUVar9);
              pUVar6 = pUVar6 + 0x280;
            }
            pUVar6 = (UI *)local_2838;
            for (uVar5 = 0; uVar5 < 0x100; uVar5 = uVar5 + 0x10) {
              pUVar9 = pUVar7;
              fVar2 = fdb_snapshot_open(local_3838[uVar5],(fdb_kvs_handle **)pUVar7,
                                        0xffffffffffffffff);
              if (fVar2 != FDB_RESULT_SUCCESS) {
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                              ,0x14a,"void do_bench()");
              }
              *(fdb_kvs_handle **)pUVar6 = *(fdb_kvs_handle **)pUVar7;
              reader(pUVar6,pUVar9);
              pUVar6 = pUVar6 + 0x280;
              pUVar7 = pUVar7 + 0x80;
            }
            for (uVar5 = 0; uVar5 != 0x100; uVar5 = uVar5 + 1) {
              pUVar9 = (UI_STRING *)(uVar5 & 0xffffffff);
              writer((UI *)local_3838[uVar5],pUVar9);
            }
            for (uVar5 = 0; uVar5 != 0x100; uVar5 = uVar5 + 1) {
              pUVar9 = (UI_STRING *)(uVar5 & 0xffffffff);
              deletes(local_3838[uVar5],(int)uVar5);
            }
            pUVar6 = (UI *)local_2838;
            for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1) {
              *(fdb_kvs_handle **)pUVar6 = local_3838[lVar8];
              reader(pUVar6,pUVar9);
              pUVar6 = pUVar6 + 0x28;
            }
            pUVar6 = (UI *)local_2838;
            for (lVar8 = 0; lVar8 != 0x800; lVar8 = lVar8 + 8) {
              pUVar7 = (UI_STRING *)((long)local_3038 + lVar8);
              fVar2 = fdb_snapshot_open(*(fdb_kvs_handle **)((long)local_3838 + lVar8),
                                        (fdb_kvs_handle **)pUVar7,0xffffffffffffffff);
              if (fVar2 != FDB_RESULT_SUCCESS) {
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                              ,0x15d,"void do_bench()");
              }
              *(undefined8 *)pUVar6 = *(undefined8 *)((long)local_3038 + lVar8);
              reader(pUVar6,pUVar7);
              pUVar6 = pUVar6 + 0x28;
            }
            lVar8 = 0;
            while (lVar8 != 0x10) {
              fVar2 = fdb_commit(local_3a78[lVar8],'\x01');
              lVar8 = lVar8 + 1;
              if (fVar2 != FDB_RESULT_SUCCESS) {
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                              ,0x165,"void do_bench()");
              }
            }
            iVar3 = iVar3 + 1;
          }
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                  ,0x121);
          do_bench()::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                        ,0x121,"void do_bench()");
        }
        fVar2 = fdb_commit(local_3a78[lVar8],'\x01');
        lVar8 = lVar8 + 1;
      } while (fVar2 == FDB_RESULT_SUCCESS);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                    ,0x111,"void do_bench()");
    }
    sprintf(fname,"bench%d",uVar5 & 0xffffffff);
    fVar2 = fdb_open(local_3a78 + uVar5,fname,&fconfig);
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    lVar8 = 0;
    ptr_handle = ppfVar10;
    while (lVar8 != 0x10) {
      sprintf(dbname,"db%d",(ulong)(uint)(iVar3 + (int)lVar8));
      fVar2 = fdb_kvs_open(local_3a78[uVar5],ptr_handle,dbname,&kvs_config);
      lVar8 = lVar8 + 1;
      ptr_handle = ptr_handle + 1;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                      ,0x109,"void do_bench()");
      }
    }
    uVar5 = uVar5 + 1;
    iVar3 = iVar3 + 0x10;
    ppfVar10 = ppfVar10 + 0x10;
  }
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                ,0x103,"void do_bench()");
}

Assistant:

void do_bench() {

    TEST_INIT();
    int i, j, r;
    int n_loops = 5;
    int n_kvs = 16;

    char cmd[64], fname[64], dbname[64];
    int n2_kvs = n_kvs * n_kvs;

    // file handlers
    fdb_status status;
    fdb_file_handle **dbfile = alca(fdb_file_handle*, n_kvs);
    fdb_kvs_handle **db = alca(fdb_kvs_handle*, n2_kvs);
    fdb_kvs_handle **snap_db = alca(fdb_kvs_handle*, n2_kvs);
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();

    // reader stats
    reader_context *ctx = alca(reader_context, n2_kvs);

    StatAggregator *sa = new StatAggregator(4, n2_kvs);

    for (i = 0; i < n2_kvs; ++i) {
        sa->t_stats[0][i].name.assign(ST_ITR_INIT);
        sa->t_stats[1][i].name.assign(ST_ITR_NEXT);
        sa->t_stats[2][i].name.assign(ST_ITR_GET);
        sa->t_stats[3][i].name.assign(ST_ITR_CLOSE);
        ctx[i].stat_itr_init = &sa->t_stats[0][i];
        ctx[i].stat_itr_next = &sa->t_stats[1][i];
        ctx[i].stat_itr_get = &sa->t_stats[2][i];
        ctx[i].stat_itr_close = &sa->t_stats[3][i];
    }

    sprintf(cmd, "rm bench* > errorlog.txt");
    r = system(cmd);
    (void)r;

    // setup
    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    fconfig.auto_commit = false;
    fconfig.compactor_sleep_duration = 600;
    fconfig.prefetch_duration = 0;
    fconfig.num_compactor_threads = 1;
    fconfig.num_bgflusher_threads = 0;

    // open 16 dbfiles each with 16 kvs
    for (i = 0; i < n_kvs; ++i){
        sprintf(fname, "bench%d",i);
        status = fdb_open(&dbfile[i], fname, &fconfig);
        assert(status == FDB_RESULT_SUCCESS);

        for (j = i*n_kvs; j < (i*n_kvs + n_kvs); ++j){
            sprintf(dbname, "db%d",j);
            status = fdb_kvs_open(dbfile[i], &db[j],
                                  dbname, &kvs_config);
            assert(status == FDB_RESULT_SUCCESS);
        }
    }

    for (i = 0; i < 10; ++i){
        // generate initial commit headers
        for (i = 0; i < n_kvs; i++){
            status = fdb_commit(dbfile[i], FDB_COMMIT_MANUAL_WAL_FLUSH);
            assert(status == FDB_RESULT_SUCCESS);
        }
    }

    for (j = 0; j < n_loops; j++){

        // write to single file 1 kvs
        writer(db[0], 0);

        // reads from single file 1 kvs
        ctx[0].handle = db[0];
        reader(&ctx[0]);

        // snap iterator read
        status = fdb_snapshot_open(db[0], &snap_db[0],
                                   FDB_SNAPSHOT_INMEM);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        ctx[0].handle = snap_db[0];
        reader(&ctx[0]);

       // write/read/snap to single file 16 kvs
        for (i = 0;i < n_kvs; ++i){
            writer(db[i], i);
        }
        for (i = 0; i < n_kvs; ++i){
            deletes(db[i], i);
        }
        for (i = 0; i < n_kvs; ++i){
            ctx[i].handle = db[i];
            reader(&ctx[i]);
        }
        for (i = 0; i < n_kvs; ++i){
            status = fdb_snapshot_open(db[i], &snap_db[i],
                                       FDB_SNAPSHOT_INMEM);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            ctx[i].handle = snap_db[i];
            reader(&ctx[i]);
        }

        // commit single file
        status = fdb_commit(dbfile[0], FDB_COMMIT_MANUAL_WAL_FLUSH);
        assert(status == FDB_RESULT_SUCCESS);

        // write/write/snap to 16 files 1 kvs
        for (i = 0; i < n2_kvs; i += n_kvs){ // every 16 kvs is new file
            writer(db[i], i);
        }
        for (i = 0; i < n2_kvs; i += n_kvs){
            deletes(db[i], i);
        }
        for (i = 0; i < n2_kvs; i += n_kvs){ // every 16 kvs is new file
            ctx[i].handle = db[i];
            reader(&ctx[i]);
        }
        for (i = 0; i < n2_kvs; i += n_kvs){
            status = fdb_snapshot_open(db[i], &snap_db[i],
                                       FDB_SNAPSHOT_INMEM);
            assert(status == FDB_RESULT_SUCCESS);
            ctx[i].handle = snap_db[i];
            reader(&ctx[i]);
        }

        // write to 16 files 16 kvs each
        for (i = 0; i < n2_kvs; i++){
            writer(db[i], i);
        }
        for (i = 0; i < n2_kvs; ++i){
            deletes(db[i], i);
        }
        for (i = 0; i < n2_kvs; i++){
            ctx[i].handle = db[i];
            reader(&ctx[i]);
        }
        for (i = 0; i < n2_kvs; i++){
            status = fdb_snapshot_open(db[i], &snap_db[i],
                                       FDB_SNAPSHOT_INMEM);
            assert(status == FDB_RESULT_SUCCESS);
            ctx[i].handle = snap_db[i];
            reader(&ctx[i]);
        }

        // commit all
        for (i = 0;i < n_kvs; i++){
            status = fdb_commit(dbfile[i], FDB_COMMIT_MANUAL_WAL_FLUSH);
            assert(status == FDB_RESULT_SUCCESS);
        }
    }
    // compact all
    for (i = 0; i < n_kvs; i++){
        status = fdb_compact(dbfile[i], NULL);
        assert(status == FDB_RESULT_SUCCESS);
    }

    // print aggregated reader stats
    sa->aggregateAndPrintStats("ITERATOR_TEST_STATS", n_kvs * n_kvs, "µs");
    delete sa;

    // print aggregated dbfile stats
    print_db_stats(dbfile, n_kvs);

    // cleanup
    for(i = 0; i < n2_kvs; i++){
        fdb_kvs_close(db[i]);
        fdb_kvs_close(snap_db[i]);
    }
    for(i = 0; i < n_kvs; i++){
        fdb_close(dbfile[i]);
    }

    fdb_shutdown();

    (void)status;
    sprintf(cmd, "rm bench* > errorlog.txt");
    r = system(cmd);
    (void)r;

    TEST_RESULT("Benchmark done");
}